

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5Bm25Function(Fts5ExtensionApi *pApi,Fts5Context *pFts,sqlite3_context *pCtx,int nVal,
                     sqlite3_value **apVal)

{
  int iVar1;
  int in_ECX;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  double w;
  double *aFreq;
  double D;
  int i;
  double score;
  int rc;
  double b;
  double k1;
  int nTok;
  int io;
  int ic;
  int ip;
  int nInst;
  Fts5Bm25Data *pData;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  sqlite3_context *in_stack_ffffffffffffff60;
  void *local_88;
  int local_74;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 local_24;
  undefined4 local_20;
  int local_1c;
  int local_18;
  int local_14;
  int *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_14 = 0;
  local_88 = (void *)0x0;
  iVar1 = fts5Bm25GetData((Fts5ExtensionApi *)0x3fe8000000000000,
                          (Fts5Context *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffff98),
                          (Fts5Bm25Data **)0x0);
  if (iVar1 == 0) {
    local_88 = *(void **)(local_10 + 6);
    memset(local_88,0,(long)*local_10 << 3);
    iVar1 = (**(code **)(in_RDI + 0x40))(in_RSI,&local_14);
  }
  for (local_74 = 0; iVar1 == 0 && local_74 < local_14; local_74 = local_74 + 1) {
    local_18 = -0x55555556;
    local_1c = -0x55555556;
    local_20 = 0xaaaaaaaa;
    iVar1 = (**(code **)(in_RDI + 0x48))(in_RSI,local_74,&local_18,&local_1c,&local_20);
    if (iVar1 == 0) {
      if (local_1c < in_ECX) {
        in_stack_ffffffffffffff60 =
             (sqlite3_context *)sqlite3_value_double((sqlite3_value *)0x28e151);
      }
      else {
        in_stack_ffffffffffffff60 = (sqlite3_context *)0x3ff0000000000000;
      }
      *(double *)((long)local_88 + (long)local_18 * 8) =
           (double)in_stack_ffffffffffffff60 + *(double *)((long)local_88 + (long)local_18 * 8);
    }
  }
  if (iVar1 == 0) {
    local_24 = 0xaaaaaaaa;
    iVar1 = (**(code **)(in_RDI + 0x60))(in_RSI,0xffffffff,&local_24);
  }
  if (iVar1 == 0) {
    for (local_74 = 0; local_74 < *local_10; local_74 = local_74 + 1) {
    }
    sqlite3_result_double
              (in_stack_ffffffffffffff60,
               (double)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  else {
    sqlite3_result_error_code(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts5Bm25Function(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  sqlite3_context *pCtx,          /* Context for returning result/error */
  int nVal,                       /* Number of values in apVal[] array */
  sqlite3_value **apVal           /* Array of trailing arguments */
){
  const double k1 = 1.2;          /* Constant "k1" from BM25 formula */
  const double b = 0.75;          /* Constant "b" from BM25 formula */
  int rc;                         /* Error code */
  double score = 0.0;             /* SQL function return value */
  Fts5Bm25Data *pData;            /* Values allocated/calculated once only */
  int i;                          /* Iterator variable */
  int nInst = 0;                  /* Value returned by xInstCount() */
  double D = 0.0;                 /* Total number of tokens in row */
  double *aFreq = 0;              /* Array of phrase freq. for current row */

  /* Calculate the phrase frequency (symbol "f(qi,D)" in the documentation)
  ** for each phrase in the query for the current row. */
  rc = fts5Bm25GetData(pApi, pFts, &pData);
  if( rc==SQLITE_OK ){
    aFreq = pData->aFreq;
    memset(aFreq, 0, sizeof(double) * pData->nPhrase);
    rc = pApi->xInstCount(pFts, &nInst);
  }
  for(i=0; rc==SQLITE_OK && i<nInst; i++){
    int ip; int ic; int io;
    rc = pApi->xInst(pFts, i, &ip, &ic, &io);
    if( rc==SQLITE_OK ){
      double w = (nVal > ic) ? sqlite3_value_double(apVal[ic]) : 1.0;
      aFreq[ip] += w;
    }
  }

  /* Figure out the total size of the current row in tokens. */
  if( rc==SQLITE_OK ){
    int nTok;
    rc = pApi->xColumnSize(pFts, -1, &nTok);
    D = (double)nTok;
  }

  /* Determine and return the BM25 score for the current row. Or, if an
  ** error has occurred, throw an exception. */
  if( rc==SQLITE_OK ){
    for(i=0; i<pData->nPhrase; i++){
      score += pData->aIDF[i] * (
          ( aFreq[i] * (k1 + 1.0) ) /
          ( aFreq[i] + k1 * (1 - b + b * D / pData->avgdl) )
      );
    }
    sqlite3_result_double(pCtx, -1.0 * score);
  }else{
    sqlite3_result_error_code(pCtx, rc);
  }
}